

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseReserved
          (Parser *this,EnumDescriptorProto *message,LocationRecorder *message_location)

{
  bool bVar1;
  LocationRecorder location;
  Token start_token;
  
  io::Tokenizer::Token::Token(&start_token,&this->input_->current_);
  bVar1 = Consume(this,"reserved");
  if (bVar1) {
    if ((this->input_->current_).type == TYPE_STRING) {
      LocationRecorder::LocationRecorder(&location,message_location,5);
      LocationRecorder::StartAt(&location,&start_token);
      bVar1 = ParseReservedNames(this,message,&location);
    }
    else {
      LocationRecorder::LocationRecorder(&location,message_location,4);
      LocationRecorder::StartAt(&location,&start_token);
      bVar1 = ParseReservedNumbers(this,message,&location);
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&start_token.text);
  return bVar1;
}

Assistant:

bool Parser::ParseReserved(EnumDescriptorProto* message,
                           const LocationRecorder& message_location) {
  io::Tokenizer::Token start_token = input_->current();
  // Parse the declaration.
  DO(Consume("reserved"));
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    LocationRecorder location(message_location,
                              EnumDescriptorProto::kReservedNameFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNames(message, location);
  } else {
    LocationRecorder location(message_location,
                              EnumDescriptorProto::kReservedRangeFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNumbers(message, location);
  }
}